

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

ConstPixelBufferAccess *
vkt::image::anon_unknown_0::getLayerOrSlice
          (ConstPixelBufferAccess *__return_storage_ptr__,Texture *texture,
          ConstPixelBufferAccess *access,int layer)

{
  ImageType IVar1;
  int iVar2;
  int height;
  int layer_local;
  ConstPixelBufferAccess *access_local;
  Texture *texture_local;
  
  IVar1 = Texture::type(texture);
  if (IVar1 != IMAGE_TYPE_1D) {
    if (IVar1 == IMAGE_TYPE_1D_ARRAY) {
      iVar2 = tcu::ConstPixelBufferAccess::getWidth(access);
      tcu::getSubregion(__return_storage_ptr__,access,0,layer,iVar2,1);
      return __return_storage_ptr__;
    }
    if (IVar1 != IMAGE_TYPE_2D) {
      if (IVar1 - IMAGE_TYPE_2D_ARRAY < 4) {
        iVar2 = tcu::ConstPixelBufferAccess::getWidth(access);
        height = tcu::ConstPixelBufferAccess::getHeight(access);
        tcu::getSubregion(__return_storage_ptr__,access,0,0,layer,iVar2,height,1);
        return __return_storage_ptr__;
      }
      if (IVar1 != IMAGE_TYPE_BUFFER) {
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
    }
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(__return_storage_ptr__,access);
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess getLayerOrSlice (const Texture& texture, const tcu::ConstPixelBufferAccess access, const int layer)
{
	switch (texture.type())
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_BUFFER:
			// Not layered
			DE_ASSERT(layer == 0);
			return access;

		case IMAGE_TYPE_1D_ARRAY:
			return tcu::getSubregion(access, 0, layer, access.getWidth(), 1);

		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
		case IMAGE_TYPE_3D:			// 3d texture is treated as if depth was the layers
			return tcu::getSubregion(access, 0, 0, layer, access.getWidth(), access.getHeight(), 1);

		default:
			DE_FATAL("Internal test error");
			return tcu::ConstPixelBufferAccess();
	}
}